

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

FFSEncodeVector copy_vector_to_FFSBuffer(FFSBuffer buf,FFSEncodeVector vec)

{
  FFSEncodeVector pFVar1;
  size_t sVar2;
  ssize_t sVar3;
  ulong uVar4;
  size_t sVar5;
  
  pFVar1 = (FFSEncodeVector)buf->tmp_buffer;
  if ((vec < pFVar1) || ((FFSEncodeVector)((long)&pFVar1->iov_base + buf->tmp_buffer_size) <= vec))
  {
    sVar2 = 0;
    do {
      sVar5 = sVar2;
      sVar2 = sVar5 + 0x10;
    } while (*(long *)((long)&vec->iov_base + sVar5) != 0);
    sVar3 = add_to_tmp_buffer(buf,sVar5 + 0x20);
    uVar4 = sVar3 + 0xfU & 0xfffffffffffffff0;
    memcpy((void *)((long)buf->tmp_buffer + uVar4),vec,sVar5 + 0x10);
  }
  else {
    uVar4 = (long)vec - (long)pFVar1;
  }
  return (FFSEncodeVector)(uVar4 + (long)buf->tmp_buffer);
}

Assistant:

extern FFSEncodeVector
copy_vector_to_FFSBuffer(FFSBuffer buf, FFSEncodeVector vec)
{
    ssize_t vec_offset = (char *) vec - (char *)buf->tmp_buffer;

    if (((char*)vec < (char*)buf->tmp_buffer)
        || ((char*)vec >= (char*)buf->tmp_buffer + buf->tmp_buffer_size)) {
        size_t i, remainder;
        for (i = 0; vec[i].iov_base; ++i);
        vec_offset = add_to_tmp_buffer(buf, (i + 2) * sizeof(*vec));
	remainder = vec_offset % sizeof(*vec);
	if (remainder != 0) {
	    vec_offset += sizeof(*vec) - remainder;
	}
        memcpy((char *) buf->tmp_buffer + vec_offset, vec, (i + 1) * sizeof(*vec));
    }

    return (FFSEncodeVector) ((char *) buf->tmp_buffer + vec_offset);
}